

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
GeneratedMessageReflectionCordAccessorsTest_CordSingularOneofBytes_Test::TestBody
          (GeneratedMessageReflectionCordAccessorsTest_CordSingularOneofBytes_Test *this)

{
  undefined1 auVar1 [8];
  pointer *__ptr;
  InternalMetadata this_00;
  undefined8 uVar2;
  char *pcVar3;
  char *in_R9;
  string_view src;
  string_view src_00;
  string string_value;
  Cord cord_value;
  TestOneof2 message;
  AssertHelper local_c8;
  AssertHelper local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  AssertHelper local_70;
  anon_union_16_2_39e9c77e_for_Rep_0 local_68;
  TestOneof2 local_58;
  
  proto2_unittest::TestOneof2::TestOneof2(&local_58,(Arena *)0x0);
  src._M_str = "test";
  src._M_len = 4;
  absl::lts_20250127::Cord::Cord(((Message *)&local_68).foo_bytes_cord_,src,kConstructorString);
  if (local_58.field_0._impl_._oneof_case_[0] != 0x1e) {
    proto2_unittest::TestOneof2::clear_foo(&local_58);
    local_58.field_0._impl_._oneof_case_[0] = 0x1e;
    local_58.field_0._impl_.foo_ = (FooUnion)operator_new(0x10);
    (((InlineData *)
     &(((Message *)local_58.field_0._impl_.foo_)->super_MessageLite)._vptr_MessageLite)->rep_).
    field_0.as_tree.cordz_info = 0;
    (((Message *)local_58.field_0._impl_.foo_)->super_MessageLite)._internal_metadata_.ptr_ = 0;
    this_00.ptr_ = local_58.super_Message.super_MessageLite._internal_metadata_.ptr_;
    if ((local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      this_00.ptr_ = *(undefined8 *)
                      (local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                      0xfffffffffffffffe);
    }
    if ((ThreadSafeArena *)this_00.ptr_ != (ThreadSafeArena *)0x0) {
      protobuf::internal::ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)this_00.ptr_,(void *)local_58.field_0._impl_.foo_,
                 protobuf::internal::arena_delete_object<absl::lts_20250127::Cord>);
    }
  }
  if (local_58.field_0._impl_.foo_.foo_message_ != (FooUnion)&local_68) {
    if (((*(byte *)local_58.field_0._impl_.foo_ & 1) == 0) && ((local_68.data[0] & 1U) == 0)) {
      *(ulong *)local_58.field_0._impl_.foo_ =
           CONCAT71(local_68.as_tree.cordz_info._1_7_,local_68.data[0]);
      ((InternalMetadata *)((long)local_58.field_0._impl_.foo_ + 8))->ptr_ =
           (intptr_t)local_68.as_tree.rep;
    }
    else {
      absl::lts_20250127::Cord::InlineRep::AssignSlow
                ((InlineRep *)local_58.field_0._impl_.foo_,(InlineRep *)&local_68.as_tree);
    }
  }
  uVar2 = local_58.field_0._impl_.foo_;
  if (local_58.field_0._impl_._oneof_case_[0] != 0x1e) {
    uVar2 = protobuf::internal::empty_cord_;
  }
  testing::internal::CmpHelperEQ<char[5],absl::lts_20250127::Cord>
            ((internal *)local_90,"\"test\"","message.foo_bytes_cord()",(char (*) [5])0x142def0,
             (Cord *)uVar2);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)CONCAT71(local_b0._1_7_,local_b0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b0._1_7_,local_b0[0]) + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  local_b0[0] = (internal)(local_58.field_0._impl_._oneof_case_[0] == 0x1e);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_b0,
               (AssertionResult *)"message.has_foo_bytes_cord()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68c,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  proto2_unittest::TestOneof2::clear_foo(&local_58);
  local_b0[0] = (internal)(local_58.field_0._impl_._oneof_case_[0] != 0x1e);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0[0]) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_b0,
               (AssertionResult *)"message.has_foo_bytes_cord()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x68e,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_90 != (undefined1  [8])&local_80) {
      operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) + 8))();
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
  }
  local_90 = (undefined1  [8])&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"test","");
  auVar1 = local_90;
  if (local_58.field_0._impl_._oneof_case_[0] != 0x1e) {
    proto2_unittest::TestOneof2::clear_foo(&local_58);
    local_58.field_0._impl_._oneof_case_[0] = 0x1e;
    local_58.field_0._impl_.foo_ = (FooUnion)operator_new(0x10);
    (((Message *)local_58.field_0._impl_.foo_)->super_MessageLite)._vptr_MessageLite =
         (_func_int **)0x0;
    (((Message *)local_58.field_0._impl_.foo_)->super_MessageLite)._internal_metadata_.ptr_ = 0;
    if ((local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           *(undefined8 *)
            (local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe)
      ;
    }
    if ((ThreadSafeArena *)local_58.super_Message.super_MessageLite._internal_metadata_.ptr_ !=
        (ThreadSafeArena *)0x0) {
      protobuf::internal::ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)
                 local_58.super_Message.super_MessageLite._internal_metadata_.ptr_,
                 (void *)local_58.field_0._impl_.foo_,
                 protobuf::internal::arena_delete_object<absl::lts_20250127::Cord>);
    }
  }
  src_00._M_str = (char *)auVar1;
  src_00._M_len = (size_t)local_88;
  absl::lts_20250127::Cord::operator=((Cord *)local_58.field_0._impl_.foo_,src_00);
  uVar2 = local_58.field_0._impl_.foo_;
  if (local_58.field_0._impl_._oneof_case_[0] != 0x1e) {
    uVar2 = protobuf::internal::empty_cord_;
  }
  testing::internal::CmpHelperEQ<char[5],absl::lts_20250127::Cord>
            ((internal *)local_b0,"\"test\"","message.foo_bytes_cord()",(char (*) [5])0x142def0,
             (Cord *)uVar2);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar3 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x692,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if ((long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c0.data_._1_7_,local_c0.data_._0_1_) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_c0.data_._0_1_ = (internal)(local_58.field_0._impl_._oneof_case_[0] == 0x1e);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c0.data_._0_1_) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b0,(internal *)&local_c0,
               (AssertionResult *)"message.has_foo_bytes_cord()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x693,(char *)CONCAT71(local_b0._1_7_,local_b0[0]));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_b0._1_7_,local_b0[0]) != &local_a0) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_b0._1_7_,local_b0[0]),local_a0._M_allocated_capacity + 1);
    }
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
    if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b8,local_b8);
    }
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
  }
  absl::lts_20250127::Cord::~Cord((Cord *)&local_68.as_tree);
  proto2_unittest::TestOneof2::~TestOneof2(&local_58);
  return;
}

Assistant:

TEST_F(GeneratedMessageReflectionCordAccessorsTest, CordSingularOneofBytes) {
  unittest::TestOneof2 message;
  absl::Cord cord_value("test");
  message.set_foo_bytes_cord(cord_value);
  EXPECT_EQ("test", message.foo_bytes_cord());

  EXPECT_TRUE(message.has_foo_bytes_cord());
  message.clear_foo();
  EXPECT_FALSE(message.has_foo_bytes_cord());

  std::string string_value = "test";
  message.set_foo_bytes_cord(string_value);
  EXPECT_EQ("test", message.foo_bytes_cord());
  EXPECT_TRUE(message.has_foo_bytes_cord());
}